

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::RenderTexture::exec(RenderTexture *this,Thread *t)

{
  code *pcVar1;
  deUint32 dVar2;
  deBool dVar3;
  MessageBuilder *pMVar4;
  Program *pPVar5;
  Texture *pTVar6;
  MessageBuilder local_2f58;
  MessageBuilder local_2dc8;
  MessageBuilder local_2c38;
  MessageBuilder local_2aa8;
  MessageBuilder local_2918;
  MessageBuilder local_2788;
  MessageBuilder local_25f8;
  MessageBuilder local_2468;
  MessageBuilder local_22d8;
  MessageBuilder local_2148;
  MessageBuilder local_1fb8;
  MessageBuilder local_1e28;
  undefined8 uStack_1c98;
  float coords [12];
  MessageBuilder local_1c60;
  MessageBuilder local_1ad0;
  MessageBuilder local_1940;
  MessageBuilder local_17b0;
  MessageBuilder local_1620;
  int local_148c;
  undefined1 local_1488 [4];
  GLint posLoc;
  MessageBuilder local_12f8;
  MessageBuilder local_1168;
  MessageBuilder local_fd8;
  int local_e44;
  undefined1 local_e40 [4];
  GLint samplerPos;
  MessageBuilder local_cb0;
  MessageBuilder local_b20;
  MessageBuilder local_990;
  MessageBuilder local_800;
  MessageBuilder local_670;
  MessageBuilder local_4e0;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  RenderTexture *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [46])"Begin -- glClearColor(0.5f, 0.5f, 0.5f, 1.0f)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x1c0))
              (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"clearColor(0.5f, 0.5f, 0.5f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6de);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_350,(char (*) [22])"End -- glClearColor()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
  tcu::ThreadUtil::Thread::newMessage(&local_4e0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_4e0,(char (*) [38])"Begin -- glClear(GL_COLOR_BUFFER_BIT)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4e0);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x188))(0x4000);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6e2);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_670,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_670,(char (*) [17])"End -- glClear()")
  ;
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_670);
  tcu::ThreadUtil::Thread::newMessage(&local_800,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_800,(char (*) [23])"Begin -- glUseProgram(");
  pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pPVar5->program);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2a85ff4);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_800);
  do {
    pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x1680);
    pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
    (*pcVar1)(pPVar5->program);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"useProgram(m_program->program)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6e6);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_990,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_990,(char (*) [22])"End -- glUseProgram()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_990);
  tcu::ThreadUtil::Thread::newMessage(&local_b20,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_b20,(char (*) [39])"Begin -- glBindTexture(GL_TEXTURE_2D, ");
  pTVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pTVar6->texture);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2a85ff4);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_b20);
  do {
    pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0xb8);
    pTVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
    (*pcVar1)(0xde1,pTVar6->texture);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindTexture(GL_TEXTURE_2D, m_texture->texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6ea);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_cb0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_cb0,(char (*) [23])"End -- glBindTexture()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_cb0);
  tcu::ThreadUtil::Thread::newMessage((MessageBuilder *)local_e40,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     ((MessageBuilder *)local_e40,(char (*) [31])"Begin -- glGetUniformLocation(");
  pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pPVar5->program);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [15])", \"u_sampler\")");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder((MessageBuilder *)local_e40);
  pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0xb48);
  pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
  local_e44 = (*pcVar1)(pPVar5->program,"u_sampler");
  dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
  glu::checkError(dVar2,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                  ,0x6ef);
  tcu::ThreadUtil::Thread::newMessage(&local_fd8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_fd8,(char (*) [30])"End -- glGetUniformLocation()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_fd8);
  tcu::ThreadUtil::Thread::newMessage(&local_1168,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1168,(char (*) [22])"Begin -- glUniform1i(");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_e44);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [5])0x2c01243);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1168);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x14f0))(local_e44,0);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"uniform1i(samplerPos, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6f3);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_12f8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_12f8,(char (*) [21])"End -- glUniform1i()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_12f8);
  tcu::ThreadUtil::Thread::newMessage((MessageBuilder *)local_1488,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1488,(char (*) [30])"Begin -- glGetAttribLocation(");
  pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pPVar5->program);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [11])", \"a_pos\")");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1488);
  pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x780);
  pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
  local_148c = (*pcVar1)(pPVar5->program,"a_pos");
  dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
  glu::checkError(dVar2,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                  ,0x6f9);
  tcu::ThreadUtil::Thread::newMessage(&local_1620,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_1620,(char (*) [8])"End -- ");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_148c);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (pMVar4,(char (*) [25])" = glGetAttribLocation()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1620);
  tcu::ThreadUtil::Thread::newMessage(&local_17b0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_17b0,(char (*) [36])"Begin -- glEnableVertexAttribArray(");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_148c);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2a85ff4);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_17b0);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x610))(local_148c);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"enableVertexAttribArray(posLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6fd);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_1940,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1940,(char (*) [35])"End -- glEnableVertexAttribArray()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1940);
  tcu::ThreadUtil::Thread::newMessage(&local_1ad0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1ad0,(char (*) [42])"Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1ad0);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x40))(0x8892,0);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x701);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_1c60,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1c60,(char (*) [22])"End -- glBindBuffer()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1c60);
  coords[6] = -1.0;
  coords[7] = 1.0;
  coords[8] = -1.0;
  coords[9] = -1.0;
  coords[2] = 1.0;
  coords[3] = 1.0;
  coords[4] = 1.0;
  coords[5] = 1.0;
  uStack_1c98 = 0xbf800000bf800000;
  coords[0] = 1.0;
  coords[1] = -1.0;
  tcu::ThreadUtil::Thread::newMessage(&local_1e28,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1e28,(char (*) [32])"Begin -- glVertexAttribPointer(");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_148c);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (pMVar4,(char (*) [33])", GL_FLOAT, GL_FALSE, 0, <data>)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1e28);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x19f0))
              (local_148c,2,0x1406,0,0,&uStack_1c98);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"vertexAttribPointer(posLoc, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x710);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_1fb8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1fb8,(char (*) [31])"End -- glVertexAttribPointer()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1fb8);
  tcu::ThreadUtil::Thread::newMessage(&local_2148,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_2148,(char (*) [42])"Begin -- glDrawArrays(GL_TRIANGLES, 0, 6)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_2148);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x538))(4,0,6);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"drawArrays(GL_TRIANGLES, 0, 6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x714);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_22d8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_22d8,(char (*) [22])"End -- glDrawArrays()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_22d8);
  tcu::ThreadUtil::Thread::newMessage(&local_2468,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_2468,(char (*) [42])"Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_2468);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x40))(0x8892,0);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x718);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_25f8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_25f8,(char (*) [22])"End -- glBindBuffer()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_25f8);
  tcu::ThreadUtil::Thread::newMessage(&local_2788,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_2788,(char (*) [41])"Begin -- glBindTexture(GL_TEXTURE_2D, 0)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_2788);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0xb8))(0xde1,0);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x71c);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_2918,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_2918,(char (*) [23])"End -- glBindTexture()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_2918);
  tcu::ThreadUtil::Thread::newMessage(&local_2aa8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_2aa8,(char (*) [37])"Begin -- glDisableVertexAttribArray(");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_148c);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2a85ff4);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_2aa8);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x518))(local_148c);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"disableVertexAttribArray(posLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x720);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_2c38,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_2c38,(char (*) [36])"End -- glDisableVertexAttribArray()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_2c38);
  tcu::ThreadUtil::Thread::newMessage(&local_2dc8,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_2dc8,(char (*) [25])"Begin -- glUseProgram(0)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_2dc8);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x1680))(0);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"useProgram(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x724);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_2f58,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_2f58,(char (*) [22])"End -- glUseProgram()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_2f58);
  return;
}

Assistant:

void RenderTexture::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glClearColor(0.5f, 0.5f, 0.5f, 1.0f)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, clearColor(0.5f, 0.5f, 0.5f, 1.0f));
	thread.newMessage() << "End -- glClearColor()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glClear(GL_COLOR_BUFFER_BIT)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, clear(GL_COLOR_BUFFER_BIT));
	thread.newMessage() << "End -- glClear()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glUseProgram(" << m_program->program << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, useProgram(m_program->program));
	thread.newMessage() << "End -- glUseProgram()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, " << m_texture->texture << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, m_texture->texture));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glGetUniformLocation(" << m_program->program << ", \"u_sampler\")" << tcu::ThreadUtil::Message::End;
	GLint samplerPos = thread.gl.getUniformLocation(m_program->program, "u_sampler");
	GLU_CHECK_GLW_MSG(thread.gl, "glGetUniformLocation()");
	thread.newMessage() << "End -- glGetUniformLocation()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glUniform1i(" << samplerPos << ", 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, uniform1i(samplerPos, 0));
	thread.newMessage() << "End -- glUniform1i()" << tcu::ThreadUtil::Message::End;


	thread.newMessage() << "Begin -- glGetAttribLocation(" << m_program->program << ", \"a_pos\")" << tcu::ThreadUtil::Message::End;
	GLint posLoc = thread.gl.getAttribLocation(m_program->program, "a_pos");
	GLU_CHECK_GLW_MSG(thread.gl, "glGetAttribLocation()");
	thread.newMessage() << "End -- " << posLoc << " = glGetAttribLocation()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glEnableVertexAttribArray(" << posLoc << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, enableVertexAttribArray(posLoc));
	thread.newMessage() << "End -- glEnableVertexAttribArray()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(GL_ARRAY_BUFFER, 0));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;


	float coords[] = {
		-1.0, -1.0,
		 1.0, -1.0,
		 1.0,  1.0,

		 1.0,  1.0,
		-1.0,  1.0,
		-1.0, -1.0
	};

	thread.newMessage() << "Begin -- glVertexAttribPointer(" << posLoc << ", GL_FLOAT, GL_FALSE, 0, <data>)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, vertexAttribPointer(posLoc, 2, GL_FLOAT, GL_FALSE, 0, coords));
	thread.newMessage() << "End -- glVertexAttribPointer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glDrawArrays(GL_TRIANGLES, 0, 6)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, drawArrays(GL_TRIANGLES, 0, 6));
	thread.newMessage() << "End -- glDrawArrays()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(GL_ARRAY_BUFFER, 0));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, 0));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glDisableVertexAttribArray(" << posLoc << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, disableVertexAttribArray(posLoc));
	thread.newMessage() << "End -- glDisableVertexAttribArray()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glUseProgram(0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, useProgram(0));
	thread.newMessage() << "End -- glUseProgram()" << tcu::ThreadUtil::Message::End;
}